

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

void __thiscall Centaurus::CharClass<wchar_t>::CharClass(CharClass<wchar_t> *this,wchar_t ch)

{
  Range<wchar_t> local_20;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_001a74f0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._vptr_Range = (_func_int **)&PTR__Range_001a75a0;
  local_20.m_end = ch + L'\x01';
  local_20.m_start = ch;
  std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
  emplace_back<Centaurus::Range<wchar_t>>
            ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
             &this->m_ranges,&local_20);
  return;
}

Assistant:

CharClass(wchar_t ch)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(ch, ch + 1));
    }